

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O3

void __thiscall brotli::BrotliCompressor::~BrotliCompressor(BrotliCompressor *this)

{
  RingBuffer *pRVar1;
  Hashers *this_00;
  
  if (this->storage_ != (uint8_t *)0x0) {
    operator_delete__(this->storage_);
  }
  free(this->commands_);
  pRVar1 = this->ringbuffer_;
  if ((pRVar1 != (RingBuffer *)0x0) && (pRVar1->data_ != (uint8_t *)0x0)) {
    operator_delete__(pRVar1->data_);
  }
  operator_delete(pRVar1,0x20);
  this_00 = this->hashers_;
  if (this_00 != (Hashers *)0x0) {
    Hashers::~Hashers(this_00);
  }
  operator_delete(this_00,0x48);
  if (this->large_table_ != (int *)0x0) {
    operator_delete__(this->large_table_);
  }
  if (this->command_buf_ != (uint32_t *)0x0) {
    operator_delete__(this->command_buf_);
  }
  if (this->literal_buf_ != (uint8_t *)0x0) {
    operator_delete__(this->literal_buf_);
    return;
  }
  return;
}

Assistant:

BrotliCompressor::~BrotliCompressor() {
  delete[] storage_;
  free(commands_);
  delete ringbuffer_;
  delete hashers_;
  delete[] large_table_;
  delete[] command_buf_;
  delete[] literal_buf_;
}